

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindBuffersTest::iterate(ErrorsBindBuffersTest *this)

{
  GLenum target;
  undefined4 uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  long lVar11;
  TestError *pTVar12;
  long lVar13;
  long lVar14;
  Buffer *this_00;
  long lVar15;
  int iVar16;
  long lVar17;
  GLint max_buffers;
  GLint offset_alignment;
  GLuint buffer_ids [4];
  GLuint t_buffer_ids [4];
  GLintptr t_sizes [4];
  GLintptr offsets [4];
  GLintptr sizes [4];
  Buffer buffer;
  uint local_324;
  string local_320;
  int local_2fc;
  GLuint local_2f8 [6];
  long local_2e0;
  Enum<int,_2UL> local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  Enum<int,_2UL> local_2b8;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  Enum<int,_2UL> local_298;
  Enum<int,_2UL> local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  long local_268;
  int iStack_260;
  undefined4 uStack_25c;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  long local_240;
  long local_238;
  ulong local_230;
  Enum<int,_2UL> local_228;
  Buffer local_218 [4];
  undefined1 local_1b0 [8];
  GLenum local_1a8;
  ios_base local_138 [264];
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  local_218[0].m_id = 0xffffffff;
  local_218[0].m_context = (Context *)0x0;
  local_218[0].m_target = 0x8892;
  MultiBind::Buffer::InitData
            (local_218,(this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
  (**(code **)(lVar11 + 0x58))(0x8892,0,1,local_218);
  iVar9 = (**(code **)(lVar11 + 0x800))();
  if (iVar9 != 0x500) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
    std::ostream::operator<<((ostringstream *)&local_1a8,0x66c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,". Got wrong error: ",0x13);
    local_320._M_dataplus._M_p = (pointer)glu::getErrorName;
    local_320._M_string_length._0_4_ = iVar9;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_320,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
    local_288.m_getName = glu::getErrorName;
    local_288.m_value = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream(&local_288,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"BindBuffersBase with invalid <target>",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x66c);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar11 + 0x60))(0x8892,0,1,local_218,&iterate::offset);
  iVar9 = (**(code **)(lVar11 + 0x800))();
  if (iVar9 != 0x500) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
    std::ostream::operator<<((ostringstream *)&local_1a8,0x66f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,". Got wrong error: ",0x13);
    local_320._M_dataplus._M_p = (pointer)glu::getErrorName;
    local_320._M_string_length._0_4_ = iVar9;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_320,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
    local_288.m_getName = glu::getErrorName;
    local_288.m_value = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream(&local_288,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"BindBuffersRange with invalid <target>",0x26);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x66f);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  MultiBind::Buffer::~Buffer(local_218);
  lVar14 = 0;
  local_240 = lVar11;
  while( true ) {
    target = (&s_buffer_infos)[lVar14 * 5];
    iVar9 = (&DAT_01a57c94)[lVar14 * 5];
    uVar1 = (&DAT_01a57c9c)[lVar14 * 5];
    local_1b0 = (undefined1  [8])glu::getBufferTargetName;
    local_238 = lVar14;
    local_1a8 = target;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_320,local_1b0);
    local_2fc = 1;
    local_324 = 0;
    if (iVar9 == 0) {
      lVar14 = 0x10;
      lVar17 = 4;
      lVar13 = 0xc;
    }
    else {
      (**(code **)(lVar11 + 0x868))(iVar9,&local_2fc);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"GetIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x689);
      lVar17 = (long)local_2fc;
      lVar14 = lVar17 + 0x10;
      lVar13 = 0x10;
    }
    (**(code **)(lVar11 + 0x868))(uVar1,&local_324);
    dVar10 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar10,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x692);
    iVar9 = local_324 - 1;
    if (3 < (int)local_324) {
      iVar9 = 3;
    }
    local_2e0 = (long)iVar9;
    lVar11 = 0x10;
    do {
      *(undefined4 *)((long)local_218 + lVar11 + -0x10) = 0xffffffff;
      *(undefined8 *)((long)local_218 + lVar11 + -8) = 0;
      *(undefined4 *)((long)&local_218[0].m_id + lVar11) = 0x8892;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x70);
    uVar2 = local_324;
    if (3 < (int)local_324) {
      uVar2 = 4;
    }
    local_230 = (ulong)uVar2;
    this_00 = local_218;
    lVar15 = 0;
    do {
      MultiBind::Buffer::InitData
                (this_00,(this->super_TestCase).m_context,target,0x88ea,lVar14,(GLvoid *)0x0);
      lVar11 = local_240;
      *(GLuint *)((long)local_2f8 + lVar15) = this_00->m_id;
      *(long *)((long)&local_288.m_getName + lVar15 * 2) = lVar17;
      *(long *)((long)&local_268 + lVar15 * 2) = lVar13;
      lVar15 = lVar15 + 4;
      this_00 = this_00 + 1;
    } while (lVar15 != 0x10);
    iVar9 = local_324 - 3;
    iVar16 = local_324 + 1;
    if ((int)local_324 < 4) {
      iVar9 = 0;
    }
    else {
      iVar16 = 4;
    }
    (**(code **)(local_240 + 0x58))(target,iVar9,iVar16,local_2f8);
    local_2d8.m_value = (**(code **)(lVar11 + 0x800))();
    if (local_2d8.m_value != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Got wrong error: ",0x13);
      local_2d8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2d8,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
      local_2b8.m_getName = glu::getErrorName;
      local_2b8.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"BindBuffersBase with invalid <first> + <count>, target: ",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                 CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6c0);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar11 + 0x60))(target,iVar9,iVar16,local_2f8,&local_288,&local_268);
    local_2d8.m_value = (**(code **)(lVar11 + 0x800))();
    if (local_2d8.m_value != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6c4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Got wrong error: ",0x13);
      local_2d8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2d8,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
      local_2b8.m_getName = glu::getErrorName;
      local_2b8.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"BindBuffersRange with invalid <first> + <count>, target: ",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                 CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6c4);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar9 = 1;
    while (cVar8 = (**(code **)(lVar11 + 0xc68))(iVar9), cVar8 == '\x01') {
      iVar9 = iVar9 + 1;
    }
    *(int *)((long)&local_2d8.m_getName + local_2e0 * 4) = iVar9;
    uVar7 = local_230;
    (**(code **)(lVar11 + 0x58))(target,0,local_230 & 0xffffffff,&local_2d8);
    iVar9 = (**(code **)(lVar11 + 0x800))();
    if (iVar9 != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6df);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Got wrong error: ",0x13);
      local_2b8.m_getName = glu::getErrorName;
      local_2b8.m_value = iVar9;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
      local_298.m_getName = glu::getErrorName;
      local_298.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_298,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"BindBuffersBase with invalid buffer id, target: ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                 CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6df);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar11 + 0x60))(target,0,uVar7 & 0xffffffff,&local_2d8,&local_288,&local_268);
    iVar9 = (**(code **)(lVar11 + 0x800))();
    if (iVar9 != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6e2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Got wrong error: ",0x13);
      local_2b8.m_getName = glu::getErrorName;
      local_2b8.m_value = iVar9;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
      local_298.m_getName = glu::getErrorName;
      local_298.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_298,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"BindBuffersRange with invalid buffer id, target: ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                 CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6e2);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_2d8.m_getName = local_288.m_getName;
    local_2c8 = local_278;
    uStack_2c0 = uStack_270;
    local_2b8.m_value = iStack_260;
    local_2b8._12_4_ = uStack_25c;
    local_2a8 = local_258;
    uStack_2a4 = uStack_254;
    uStack_2a0 = uStack_250;
    uStack_29c = uStack_24c;
    (&local_2d8.m_getName)[local_2e0] = (GetNameFunc)0xffffffffffffffff;
    (&local_2b8.m_getName)[local_2e0] = (GetNameFunc)0xffffffffffffffff;
    (**(code **)(lVar11 + 0x60))(target,0,uVar7 & 0xffffffff,local_2f8,&local_2d8,&local_268);
    local_298.m_value = (**(code **)(lVar11 + 0x800))();
    if (local_298.m_value != 0x501) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6f3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Got wrong error: ",0x13);
      local_298.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_298,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
      local_228.m_getName = glu::getErrorName;
      local_228.m_value = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"BindBuffersRange with negative offset, target: ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                 CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6f3);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar11 + 0x60))(target,0,uVar7 & 0xffffffff,local_2f8,&local_288,&local_2b8);
    local_298.m_value = (**(code **)(lVar11 + 0x800))();
    uVar6 = uStack_24c;
    uVar5 = uStack_250;
    uVar4 = uStack_254;
    uVar3 = local_258;
    uVar1 = uStack_25c;
    iVar9 = iStack_260;
    if (local_298.m_value != 0x501) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6f7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Got wrong error: ",0x13);
      local_298.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_298,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
      local_228.m_getName = glu::getErrorName;
      local_228.m_value = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"BindBuffersRange with negative size, target: ",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                 CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6f7);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_2d8._8_8_ = (ulong)(uint)local_288._12_4_ << 0x20;
    local_2d8.m_getName = local_288.m_getName;
    local_2c8 = local_278;
    uStack_2c0 = uStack_270;
    (&local_2d8.m_getName)[local_2e0] = (&local_2d8.m_getName)[local_2e0] + -1;
    local_2b8.m_value = iVar9;
    local_2b8._12_4_ = uVar1;
    local_2a8 = uVar3;
    uStack_2a4 = uVar4;
    uStack_2a0 = uVar5;
    uStack_29c = uVar6;
    (&local_2b8.m_getName)[local_2e0] = (GetNameFunc)(lVar13 + -1);
    (**(code **)(lVar11 + 0x60))(target,0,uVar7 & 0xffffffff,local_2f8,&local_2d8);
    local_298.m_value = (**(code **)(lVar11 + 0x800))();
    if (local_298.m_value != 0x501) break;
    if (target == 0x8c8e) {
      (**(code **)(lVar11 + 0x60))(0x8c8e,0,uVar7 & 0xffffffff,local_2f8,&local_288);
      local_298.m_value = (**(code **)(lVar11 + 0x800))();
      if (local_298.m_value != 0x501) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   ,0x7f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
        std::ostream::operator<<((ostringstream *)&local_1a8,0x70e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,". Got wrong error: ",0x13);
        local_298.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_298,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc)
        ;
        local_228.m_getName = glu::getErrorName;
        local_228.m_value = 0x501;
        tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"BindBuffersRange with invalid <size>, target: ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
                   CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar12,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   ,0x70e);
        __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    lVar14 = 0x48;
    do {
      MultiBind::Buffer::~Buffer((Buffer *)((long)&local_218[0].m_id + lVar14));
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    lVar14 = local_238 + 1;
    if (lVar14 == 4) {
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  }
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"File: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", line: ",8);
  std::ostream::operator<<((ostringstream *)&local_1a8,0x708);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,". Got wrong error: ",0x13);
  local_298.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_298,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected: ",0xc);
  local_228.m_getName = glu::getErrorName;
  local_228.m_value = 0x501;
  tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", message: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"BindBuffersRange with invalid <offset>, target: ",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_320._M_dataplus._M_p,
             CONCAT44(local_320._M_string_length._4_4_,(int)local_320._M_string_length));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x708);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	/* - INVALID_ENUM when <target> is not valid; */
	{
		static const GLintptr buffer_size = 16;
		static const GLsizei  count		  = 1;
		static const GLuint   first		  = 0;
		static const GLintptr offset	  = 4;
		static const GLintptr size		  = buffer_size - offset;

		Buffer buffer;

		buffer.InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		gl.bindBuffersBase(GL_ARRAY_BUFFER, first, count, &buffer.m_id);
		CHECK_ERROR(GL_INVALID_ENUM, "BindBuffersBase with invalid <target>");

		gl.bindBuffersRange(GL_ARRAY_BUFFER, first, count, &buffer.m_id, &offset, &size);
		CHECK_ERROR(GL_INVALID_ENUM, "BindBuffersRange with invalid <target>");
	}

	for (size_t i = 0; i < s_n_buffer_tragets; ++i)
	{
		static const GLsizei n_buffers = 4;

		const GLenum	   pname_alignment = s_buffer_infos[i].m_pname_alignment;
		const GLenum	   pname_max	   = s_buffer_infos[i].m_pname_max;
		const GLenum	   target		   = s_buffer_infos[i].m_target;
		const std::string& target_name	 = glu::getBufferTargetStr(target).toString();

		GLintptr buffer_size	  = 16;
		GLsizei  count			  = n_buffers;
		GLuint   first			  = 0;
		GLuint   invalid_id		  = 1; /* Start with 1, as 0 is not valid name */
		GLintptr offset			  = 4; /* ATOMIC and XFB require alignment of 4 */
		GLint	offset_alignment = 1;
		GLint	max_buffers	  = 0;
		GLintptr size			  = buffer_size - offset;
		size_t   validated_index  = n_buffers - 1;

		/* Get alignment */
		if (0 != pname_alignment)
		{
			gl.getIntegerv(pname_alignment, &offset_alignment);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

			buffer_size += offset_alignment;
			offset = offset_alignment;
			size   = buffer_size - offset;
		}

		/* Get max */
		gl.getIntegerv(pname_max, &max_buffers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		/* Select count so <first + count> does not exceed max.
		 * Validated index shall be in the specified range.
		 */
		if (n_buffers > max_buffers)
		{
			count			= max_buffers;
			validated_index = max_buffers - 1;
		}

		/* Storage */
		Buffer   buffer[n_buffers];
		GLuint   buffer_ids[n_buffers];
		GLintptr offsets[n_buffers];
		GLintptr sizes[n_buffers];

		/* Prepare buffers */
		for (size_t j = 0; j < n_buffers; ++j)
		{
			buffer[j].InitData(m_context, target, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

			buffer_ids[j] = buffer[j].m_id;
			offsets[j]	= offset;
			sizes[j]	  = size;
		}

		/* - INVALID_OPERATION when <first> + <count> is greater than allowed limit; */
		{
			GLsizei t_count = n_buffers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_buffers <= max_buffers)
			{
				t_first = max_buffers - n_buffers + 1;
			}
			else
			{
				t_count = max_buffers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindBuffersBase(target, t_first, t_count, buffer_ids);
			CHECK_ERROR(GL_INVALID_OPERATION,
						"BindBuffersBase with invalid <first> + <count>, target: " << target_name);

			gl.bindBuffersRange(target, t_first, t_count, buffer_ids, offsets, sizes);
			CHECK_ERROR(GL_INVALID_OPERATION,
						"BindBuffersRange with invalid <first> + <count>, target: " << target_name);
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_buffer_ids[n_buffers];

			memcpy(t_buffer_ids, buffer_ids, sizeof(buffer_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isBuffer(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_buffer_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindBuffersBase(target, first, count, t_buffer_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindBuffersBase with invalid buffer id, target: " << target_name);

			gl.bindBuffersRange(target, first, count, t_buffer_ids, offsets, sizes);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindBuffersRange with invalid buffer id, target: " << target_name);
		}

		/* - INVALID_VALUE if any value in <offsets> is less than zero; */
		{
			GLintptr t_offsets[n_buffers];
			GLintptr t_sizes[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_sizes, sizes, sizeof(sizes));

			/* Invalidate the entry */
			t_offsets[validated_index] = -1;
			t_sizes[validated_index]   = -1;

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, t_offsets, sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with negative offset, target: " << target_name);

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, offsets, t_sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with negative size, target: " << target_name);
		}

		/* - INVALID_VALUE if any pair of <offsets> and <sizes> exceeds limits. */
		{
			GLintptr t_offsets[n_buffers];
			GLintptr t_sizes[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_sizes, sizes, sizeof(sizes));

			/* Invalidate the entry */
			t_offsets[validated_index] -= 1;	 /* Not aligned by required value */
			t_sizes[validated_index] = size - 1; /* Not aligned by required value */

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, t_offsets, sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with invalid <offset>, target: " << target_name);

			/* Test */
			if (GL_TRANSFORM_FEEDBACK_BUFFER == target)
			{
				gl.bindBuffersRange(target, first, count, buffer_ids, offsets, t_sizes);
				CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with invalid <size>, target: " << target_name);
			}
		}
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}